

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int send_stream_control_frames(quicly_conn_t *conn,quicly_send_context_t *s)

{
  quicly_stream_t *stream;
  uint64_t *puVar1;
  ushort uVar2;
  st_quicly_linklist_t *psVar3;
  st_quicly_linklist_t *psVar4;
  int iVar5;
  quicly_sent_t *pqVar6;
  quicly_sent_t *pqVar7;
  byte bVar9;
  uint uVar8;
  uint8_t *puVar10;
  st_quicly_linklist_t *psVar11;
  quicly_sent_t *sent;
  quicly_sent_t *sent_1;
  quicly_sent_t *local_58;
  quicly_sent_t *local_50;
  uint local_44;
  quicly_conn_t *local_40;
  st_quicly_linklist_t *local_38;
  
  if (s->num_datagrams != s->max_datagrams) {
    local_38 = &(conn->egress).pending_streams.control;
    local_40 = conn;
    do {
      if (local_38->prev == local_38) {
        return 0;
      }
      psVar3 = (local_40->egress).pending_streams.control.next;
      stream = (quicly_stream_t *)(psVar3 + -0x10);
      if (*(int *)&psVar3[-4].next == 1) {
        iVar5 = allocate_ack_eliciting_frame(stream->conn,s,0x11,&local_58,on_ack_stop_sending);
        if (iVar5 != 0) {
          return iVar5;
        }
        psVar11 = psVar3[-0x10].next;
        (local_58->data).packet.packet_number = (uint64_t)psVar11;
        *(undefined4 *)&psVar3[-4].next = 2;
        puVar10 = s->dst;
        uVar2 = *(ushort *)((long)&psVar3[-4].next + 4);
        *puVar10 = '\x05';
        pqVar6 = (quicly_sent_t *)(puVar10 + 1);
        if ((st_quicly_linklist_t *)0x3f < psVar11) {
          if (psVar11 < (st_quicly_linklist_t *)0x4000) {
            puVar10[1] = (byte)((ulong)psVar11 >> 8) | 0x40;
            pqVar6 = (quicly_sent_t *)(puVar10 + 2);
          }
          else {
            send_stream_control_frames_cold_1();
            pqVar6 = local_58;
          }
        }
        *(uint8_t *)&pqVar6->acked = (uint8_t)psVar11;
        if (uVar2 < 0x40) {
          puVar10 = (uint8_t *)((long)&pqVar6->acked + 1);
        }
        else {
          bVar9 = (byte)(uVar2 >> 8);
          if (uVar2 < 0x4000) {
            *(byte *)((long)&pqVar6->acked + 1) = bVar9 | 0x40;
            puVar10 = (uint8_t *)((long)&pqVar6->acked + 2);
          }
          else {
            puVar10 = (uint8_t *)((long)&pqVar6->acked + 1);
            puVar10[0] = 0x80;
            puVar10[1] = '\0';
            *(byte *)((long)&pqVar6->acked + 3) = bVar9;
            puVar10 = (uint8_t *)((long)&pqVar6->acked + 4);
          }
        }
        *puVar10 = (uint8_t)uVar2;
        s->dst = puVar10 + 1;
        puVar1 = &(stream->conn->super).stats.num_frames_sent.stop_sending;
        *puVar1 = *puVar1 + 1;
      }
      iVar5 = should_send_max_stream_data(stream);
      if (iVar5 != 0) {
        psVar11 = psVar3[-6].prev;
        uVar8 = *(uint *)&psVar3[2].prev;
        iVar5 = allocate_ack_eliciting_frame
                          ((quicly_conn_t *)psVar3[-0x10].prev,s,0x11,&local_50,
                           on_ack_max_stream_data);
        if (iVar5 != 0) {
          return iVar5;
        }
        puVar10 = s->dst;
        psVar4 = psVar3[-0x10].next;
        *puVar10 = '\x11';
        pqVar6 = (quicly_sent_t *)(puVar10 + 1);
        if ((st_quicly_linklist_t *)0x3f < psVar4) {
          if (psVar4 < (st_quicly_linklist_t *)0x4000) {
            puVar10[1] = (byte)((ulong)psVar4 >> 8) | 0x40;
            pqVar6 = (quicly_sent_t *)(puVar10 + 2);
          }
          else {
            send_stream_control_frames_cold_2();
            pqVar6 = local_58;
          }
        }
        psVar11 = (st_quicly_linklist_t *)((long)&psVar11->prev + (ulong)uVar8);
        pqVar7 = (quicly_sent_t *)((long)&pqVar6->acked + 1);
        *(uint8_t *)&pqVar6->acked = (uint8_t)psVar4;
        if ((st_quicly_linklist_t *)0x3f < psVar11) {
          if (psVar11 < (st_quicly_linklist_t *)0x4000) {
            *(byte *)((long)&pqVar6->acked + 1) = (byte)((ulong)psVar11 >> 8) | 0x40;
            pqVar7 = (quicly_sent_t *)((long)&pqVar6->acked + 2);
          }
          else {
            send_stream_control_frames_cold_3();
            pqVar7 = local_58;
          }
        }
        *(uint8_t *)&pqVar7->acked = (uint8_t)psVar11;
        s->dst = (uint8_t *)((long)&pqVar7->acked + 1);
        (local_50->data).packet.packet_number = (uint64_t)psVar3[-0x10].next;
        if ((long)psVar11 < (long)psVar3[-3].next) {
          __assert_fail("value >= m->max_committed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                        ,0x69,
                        "void quicly_maxsender_record(quicly_maxsender_t *, int64_t, quicly_maxsender_sent_t *)"
                       );
        }
        psVar3[-3].next = psVar11;
        psVar3[-2].next = (st_quicly_linklist_t *)((long)&(psVar3[-2].next)->prev + 1);
        *(byte *)&psVar3[-1].prev = *(byte *)&psVar3[-1].prev & 0xfe;
        (local_50->data).packet.sent_at = (long)psVar11 * 2 + 1;
        psVar4 = psVar3[-0x10].prev;
        psVar4[0x3d].prev = (st_quicly_linklist_t *)((long)&(psVar4[0x3d].prev)->prev + 1);
        if (psVar4[0x52].prev != (st_quicly_linklist_t *)0x0) {
          (*(code *)psVar4[0x52].prev)
                    (psVar4[0x52].next,
                     "{\"type\":\"max-stream-data-send\", \"time\":%lld, \"stream-id\":%d, \"maximum\":%llu}\n"
                     ,psVar4[0x9c].prev,*(undefined4 *)&psVar3[-0x10].next,psVar11);
        }
      }
      if (*(int *)&psVar3[-3].prev == 1) {
        iVar5 = allocate_ack_eliciting_frame(stream->conn,s,0x19,&local_58,on_ack_reset_stream);
        if (iVar5 != 0) {
          return iVar5;
        }
        psVar11 = psVar3[-0x10].next;
        (local_58->data).packet.packet_number = (uint64_t)psVar11;
        *(undefined4 *)&psVar3[-3].prev = 2;
        puVar10 = s->dst;
        uVar8 = (uint)*(ushort *)((long)&psVar3[-3].prev + 4);
        psVar4 = psVar3[-10].next;
        *puVar10 = '\x04';
        pqVar6 = (quicly_sent_t *)(puVar10 + 1);
        if ((st_quicly_linklist_t *)0x3f < psVar11) {
          if (psVar11 < (st_quicly_linklist_t *)0x4000) {
            puVar10[1] = (byte)((ulong)psVar11 >> 8) | 0x40;
            pqVar6 = (quicly_sent_t *)(puVar10 + 2);
          }
          else {
            local_44 = uVar8;
            send_stream_control_frames_cold_4();
            pqVar6 = local_58;
            uVar8 = local_44;
          }
        }
        *(uint8_t *)&pqVar6->acked = (uint8_t)psVar11;
        if ((ushort)uVar8 < 0x40) {
          puVar10 = (uint8_t *)((long)&pqVar6->acked + 1);
        }
        else {
          bVar9 = (byte)(uVar8 >> 8);
          if ((uVar8 & 0xffff) < 0x4000) {
            *(byte *)((long)&pqVar6->acked + 1) = bVar9 | 0x40;
            puVar10 = (uint8_t *)((long)&pqVar6->acked + 2);
          }
          else {
            puVar10 = (uint8_t *)((long)&pqVar6->acked + 1);
            puVar10[0] = 0x80;
            puVar10[1] = '\0';
            *(byte *)((long)&pqVar6->acked + 3) = bVar9;
            puVar10 = (uint8_t *)((long)&pqVar6->acked + 4);
          }
        }
        *puVar10 = (uint8_t)uVar8;
        pqVar6 = (quicly_sent_t *)(puVar10 + 1);
        if ((st_quicly_linklist_t *)0x3f < psVar4) {
          if (psVar4 < (st_quicly_linklist_t *)0x4000) {
            puVar10[1] = (byte)((ulong)psVar4 >> 8) | 0x40;
            pqVar6 = (quicly_sent_t *)(puVar10 + 2);
          }
          else {
            send_stream_control_frames_cold_5();
            pqVar6 = local_58;
          }
        }
        *(uint8_t *)&pqVar6->acked = (uint8_t)psVar4;
        s->dst = (uint8_t *)((long)&pqVar6->acked + 1);
        puVar1 = &(stream->conn->super).stats.num_frames_sent.reset_stream;
        *puVar1 = *puVar1 + 1;
      }
      if (*(int *)&psVar3[-1].next == 1) {
        iVar5 = allocate_ack_eliciting_frame
                          (stream->conn,s,0x11,&local_50,on_ack_stream_data_blocked_frame);
        if (iVar5 != 0) {
          return iVar5;
        }
        psVar11 = psVar3[-4].prev;
        (local_50->data).packet.packet_number = (uint64_t)psVar3[-0x10].next;
        (local_50->data).ack.range.end = (uint64_t)psVar11;
        puVar10 = s->dst;
        psVar4 = psVar3[-0x10].next;
        *puVar10 = '\x15';
        pqVar6 = (quicly_sent_t *)(puVar10 + 1);
        if ((st_quicly_linklist_t *)0x3f < psVar4) {
          if (psVar4 < (st_quicly_linklist_t *)0x4000) {
            puVar10[1] = (byte)((ulong)psVar4 >> 8) | 0x40;
            pqVar6 = (quicly_sent_t *)(puVar10 + 2);
          }
          else {
            send_stream_control_frames_cold_6();
            pqVar6 = local_58;
          }
        }
        *(uint8_t *)&pqVar6->acked = (uint8_t)psVar4;
        pqVar7 = (quicly_sent_t *)((long)&pqVar6->acked + 1);
        if ((st_quicly_linklist_t *)0x3f < psVar11) {
          if (psVar11 < (st_quicly_linklist_t *)0x4000) {
            *(byte *)((long)&pqVar6->acked + 1) = (byte)((ulong)psVar11 >> 8) | 0x40;
            pqVar7 = (quicly_sent_t *)((long)&pqVar6->acked + 2);
          }
          else {
            send_stream_control_frames_cold_7();
            pqVar7 = local_58;
          }
        }
        *(uint8_t *)&pqVar7->acked = (uint8_t)psVar11;
        s->dst = (uint8_t *)((long)&pqVar7->acked + 1);
        *(undefined4 *)&psVar3[-1].next = 2;
        psVar3[-0x10].prev[0x3f].prev =
             (st_quicly_linklist_t *)((long)&(psVar3[-0x10].prev[0x3f].prev)->prev + 1);
      }
      psVar11 = psVar3->prev;
      psVar4 = psVar3->next;
      psVar11->next = psVar4;
      psVar4->prev = psVar11;
      psVar3->next = psVar3;
      psVar3->prev = psVar3;
    } while (s->num_datagrams != s->max_datagrams);
  }
  return 0;
}

Assistant:

static int send_stream_control_frames(quicly_conn_t *conn, quicly_send_context_t *s)
{
    int ret = 0;

    while (s->num_datagrams != s->max_datagrams && quicly_linklist_is_linked(&conn->egress.pending_streams.control)) {
        quicly_stream_t *stream =
            (void *)((char *)conn->egress.pending_streams.control.next - offsetof(quicly_stream_t, _send_aux.pending_link.control));
        if ((ret = send_control_frames_of_stream(stream, s)) != 0)
            goto Exit;
        quicly_linklist_unlink(&stream->_send_aux.pending_link.control);
    }

Exit:
    return ret;
}